

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_HashTable.h
# Opt level: O0

bool __thiscall
axl::sl::
HashTable<unsigned_long,_bool,_axl::sl::HashId<unsigned_long>,_axl::sl::Eq<unsigned_long,_unsigned_long>,_unsigned_long,_const_bool_&>
::setBucketCount(HashTable<unsigned_long,_bool,_axl::sl::HashId<unsigned_long>,_axl::sl::Eq<unsigned_long,_unsigned_long>,_unsigned_long,_const_bool_&>
                 *this,size_t bucketCount)

{
  undefined1 uVar1;
  size_t sVar2;
  AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>
  *this_00;
  HashTableEntry<unsigned_long,_bool> *pHVar3;
  size_t sVar4;
  AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>
  *pAVar5;
  ulong in_RSI;
  ListBase<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>
  *in_RDI;
  Bucket *newBucket;
  size_t hash;
  Entry *entry;
  Bucket *oldBucket;
  size_t i;
  size_t oldBucketCount;
  Rwi newRwi;
  Rwi oldRwi;
  bool result;
  Array<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>_>
  newTable;
  Array<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>_>
  *in_stack_ffffffffffffff38;
  IteratorBase<axl::sl::Iterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>
  in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff50;
  size_t local_68;
  Rwi local_58;
  Rwi local_50;
  undefined4 local_48;
  undefined1 local_31;
  ulong local_18;
  byte local_1;
  
  local_18 = in_RSI;
  Array<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>_>
  ::Array((Array<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>_>
           *)0x128676);
  local_31 = Array<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>_>
             ::setCount((Array<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>_>
                         *)in_stack_ffffffffffffff40.m_p,(size_t)in_stack_ffffffffffffff38);
  if ((bool)local_31) {
    Array<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>_>
    ::Rwi::Rwi((Rwi *)in_stack_ffffffffffffff40.m_p,in_stack_ffffffffffffff38);
    Array<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>_>
    ::Rwi::Rwi((Rwi *)in_stack_ffffffffffffff40.m_p,in_stack_ffffffffffffff38);
    sVar2 = ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>_>
            ::getCount((ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>_>
                        *)(in_RDI + 1));
    for (local_68 = 0; local_68 < sVar2; local_68 = local_68 + 1) {
      this_00 = Array<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>_>
                ::Rwi::operator[](&local_50,local_68);
      while( true ) {
        uVar1 = ListBase<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>
                ::isEmpty(&this_00->
                           super_ListBase<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>
                         );
        if (((uVar1 ^ 0xff) & 1) == 0) break;
        pHVar3 = ListBase<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>
                 ::removeHead((ListBase<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>
                               *)in_stack_ffffffffffffff40.m_p);
        sVar4 = HashId<unsigned_long>::operator()
                          ((HashId<unsigned_long> *)
                           &in_RDI[2].super_ListData<axl::sl::HashTableEntry<unsigned_long,_bool>_>.
                            m_tail,(pHVar3->super_MapEntry<unsigned_long,_bool>).m_key);
        pAVar5 = Array<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>_>
                 ::Rwi::operator[](&local_58,sVar4 % local_18);
        pHVar3->m_bucket = pAVar5;
        in_stack_ffffffffffffff40.m_p =
             (Entry *)ListBase<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>
                      ::insertTail(in_RDI,(HashTableEntry<unsigned_long,_bool> *)
                                          CONCAT17(uVar1,in_stack_ffffffffffffff50));
      }
    }
    Array<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>_>
    ::operator=((Array<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>_>
                 *)in_stack_ffffffffffffff40.m_p,in_stack_ffffffffffffff38);
    local_1 = 1;
  }
  else {
    local_1 = 0;
  }
  local_48 = 1;
  Array<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>_>
  ::~Array((Array<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>_>
            *)0x128846);
  return (bool)(local_1 & 1);
}

Assistant:

bool
	setBucketCount(size_t bucketCount) {
		Array<Bucket> newTable;
		bool result = newTable.setCount(bucketCount);
		if (!result)
			return false;

		typename Array<Bucket>::Rwi oldRwi = m_table;
		typename Array<Bucket>::Rwi newRwi = newTable;
		size_t oldBucketCount = m_table.getCount();
		for (size_t i = 0; i < oldBucketCount; i++) {
			Bucket* oldBucket = &oldRwi[i];
			while (!oldBucket->isEmpty()) {
				Entry* entry = oldBucket->removeHead();
				size_t hash = m_hash(entry->m_key);

				Bucket* newBucket = &newRwi[hash % bucketCount];
				entry->m_bucket = newBucket;
				newBucket->insertTail(entry);
			}
		}

		m_table = newTable;
		return true;
	}